

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void display_menu_row(menu_conflict *menu,int pos,int top,_Bool cursor,int row,int col,int width)

{
  byte bVar1;
  uint uVar2;
  menu_row_style_t mVar3;
  char *s;
  menu_row_validity_t mStack_34;
  uint8_t color;
  menu_row_style_t style;
  menu_row_validity_t row_valid;
  int oid;
  int iStack_24;
  char sel;
  int flags;
  int col_local;
  int row_local;
  _Bool cursor_local;
  int top_local;
  int pos_local;
  menu_conflict *menu_local;
  
  uVar2 = menu->flags;
  row_valid._3_1_ = MN_ROW_INVALID >> 0x18;
  mStack_34 = MN_ROW_VALID;
  style = pos;
  if (menu->filter_list != (int *)0x0) {
    style = menu->filter_list[pos];
  }
  if (menu->row_funcs->valid_row != (_func_int_menu_ptr_int *)0x0) {
    mStack_34 = (*menu->row_funcs->valid_row)(menu,style);
  }
  if (mStack_34 != MN_ROW_HIDDEN) {
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 1) == 0) {
        if ((menu->selections == (char *)0x0) || ((uVar2 & 4) != 0)) {
          if (menu->row_funcs->get_tag != (_func_char_menu_ptr_int *)0x0) {
            row_valid._3_1_ = (*menu->row_funcs->get_tag)(menu,style);
          }
        }
        else {
          row_valid._3_1_ = menu->selections[pos];
        }
      }
      else {
        row_valid._3_1_ = (*menu->skin->get_tag)(menu,pos);
      }
    }
    iStack_24 = col;
    if (row_valid._3_1_ != MN_ROW_INVALID >> 0x18) {
      mVar3 = menu_row_style_for_validity(mStack_34);
      bVar1 = curs_attrs[mVar3][(int)(uint)cursor];
      s = format("%c) ",(ulong)(uint)(int)(char)row_valid._3_1_);
      Term_putstr(col,row,L'\x03',(uint)bVar1,s);
      iStack_24 = col + 3;
      width = width + -3;
    }
    (*menu->row_funcs->display_row)(menu,style,cursor,row,iStack_24,width);
  }
  return;
}

Assistant:

static void display_menu_row(struct menu *menu, int pos, int top,
                             bool cursor, int row, int col, int width)
{
	int flags = menu->flags;
	char sel = 0;
	int oid = pos;
	menu_row_validity_t row_valid = MN_ROW_VALID;

	if (menu->filter_list)
		oid = menu->filter_list[oid];

	if (menu->row_funcs->valid_row)
		row_valid = menu->row_funcs->valid_row(menu, oid);

	if (row_valid == MN_ROW_HIDDEN)
		return;

	if (!(flags & MN_NO_TAGS)) {
		if (flags & MN_REL_TAGS)
			sel = menu->skin->get_tag(menu, pos);
		else if (menu->selections && !(flags & MN_PVT_TAGS))
			sel = menu->selections[pos];
		else if (menu->row_funcs->get_tag)
			sel = menu->row_funcs->get_tag(menu, oid);
	}

	if (sel) {
		menu_row_style_t style = menu_row_style_for_validity(row_valid);
		uint8_t color = curs_attrs[style][0 != (cursor)];
		Term_putstr(col, row, 3, color, format("%c) ", sel));
		col += 3;
		width -= 3;
	}

	menu->row_funcs->display_row(menu, oid, cursor, row, col, width);
}